

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

int fe_isnonzero(fe_loose *f)

{
  int iVar1;
  uint8_t s [32];
  fe tight;
  
  fe_carry(&tight,f);
  fe_tobytes(s,&tight);
  iVar1 = CRYPTO_memcmp(s,"",0x20);
  return (int)(iVar1 != 0);
}

Assistant:

static int fe_isnonzero(const fe_loose *f) {
  fe tight;
  fe_carry(&tight, f);
  uint8_t s[32];
  fe_tobytes(s, &tight);

  static const uint8_t zero[32] = {0};
  return CRYPTO_memcmp(s, zero, sizeof(zero)) != 0;
}